

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,FunctionCall *f)

{
  Expression *e;
  CodePrinter *this_00;
  Function *f_00;
  string local_40;
  
  if ((f->super_Assignment).target.object != (Expression *)0x0) {
    e = pool_ptr<soul::heart::Expression>::operator*(&(f->super_Assignment).target);
    printAssignmentSyntax(this,e);
  }
  this_00 = choc::text::CodePrinter::operator<<(this->out,"call ");
  f_00 = pool_ptr<soul::heart::Function>::operator*(&f->function);
  getFunctionName_abi_cxx11_(&local_40,this,f_00);
  choc::text::CodePrinter::operator<<(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(f->arguments).items;
  local_40._M_string_length = (long)local_40._M_dataplus._M_p + (f->arguments).numActive * 8;
  printArgList(this,(ArrayView<soul::pool_ref<soul::heart::Expression>_> *)&local_40);
  return;
}

Assistant:

void printDescription (const heart::FunctionCall& f)
        {
            if (f.target != nullptr)
                printAssignmentSyntax (*f.target);

            out << "call " << getFunctionName (f.getFunction());
            printArgList (f.arguments);
        }